

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O2

double HTS_b2en(HTS_Vocoder *v,double *b,int m,double a)

{
  double *pdVar1;
  double dVar2;
  double *mc;
  long lVar3;
  double *pdVar4;
  double *pdVar5;
  long lVar6;
  ulong uVar7;
  
  mc = v->spectrum2en_buff;
  uVar7 = (ulong)(uint)m;
  if (v->spectrum2en_size < uVar7) {
    if (mc != (double *)0x0) {
      HTS_free(mc);
    }
    mc = (double *)HTS_calloc((ulong)(m + 0x481),8);
    v->spectrum2en_buff = mc;
    v->spectrum2en_size = uVar7;
  }
  pdVar1 = mc + uVar7 + 0x241;
  HTS_b2mc(b,mc,m,a);
  HTS_freqt(v,v->spectrum2en_buff,m,mc + uVar7 + 1,0x23f,-a);
  dVar2 = exp(mc[uVar7 + 1]);
  *pdVar1 = dVar2;
  pdVar4 = pdVar1;
  for (lVar3 = 1; dVar2 = 0.0, lVar3 != 0x240; lVar3 = lVar3 + 1) {
    pdVar5 = pdVar4;
    lVar6 = 0;
    while (lVar3 != lVar6) {
      dVar2 = dVar2 + (double)(int)(lVar6 + 1) * mc[uVar7 + lVar6 + 2] * *pdVar5;
      pdVar5 = pdVar5 + -1;
      lVar6 = lVar6 + 1;
    }
    pdVar1[lVar3] = dVar2 / (double)(int)lVar3;
    pdVar4 = pdVar4 + 1;
  }
  for (lVar3 = 0; lVar3 != 0x240; lVar3 = lVar3 + 1) {
    dVar2 = dVar2 + pdVar1[lVar3] * pdVar1[lVar3];
  }
  return dVar2;
}

Assistant:

static double HTS_b2en(HTS_Vocoder * v, const double *b, const int m, const double a)
{
   int i;
   double en = 0.0;
   double *cep;
   double *ir;

   if (v->spectrum2en_size < m) {
      if (v->spectrum2en_buff != NULL)
         HTS_free(v->spectrum2en_buff);
      v->spectrum2en_buff = (double *) HTS_calloc((m + 1) + 2 * IRLENG, sizeof(double));
      v->spectrum2en_size = m;
   }
   cep = v->spectrum2en_buff + m + 1;
   ir = cep + IRLENG;

   HTS_b2mc(b, v->spectrum2en_buff, m, a);
   HTS_freqt(v, v->spectrum2en_buff, m, cep, IRLENG - 1, -a);
   HTS_c2ir(cep, IRLENG, ir, IRLENG);

   for (i = 0; i < IRLENG; i++)
      en += ir[i] * ir[i];

   return (en);
}